

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_slots.cpp
# Opt level: O0

Am_Slot_Key Am_From_Slot_Name(char *string)

{
  int iVar1;
  int prev_key;
  char *string_local;
  
  verify_slot_name_key_table();
  iVar1 = Am_Symbol_Table::Get_Value(Am_Slot_Name_Key_Table,string);
  if (iVar1 == -1) {
    string_local._6_2_ = 0;
  }
  else {
    string_local._6_2_ = (Am_Slot_Key)iVar1;
  }
  return string_local._6_2_;
}

Assistant:

Am_Slot_Key
Am_From_Slot_Name(const char *string)
{
  verify_slot_name_key_table();
  int prev_key = Am_Slot_Name_Key_Table->Get_Value(string);
  if (prev_key == -1)
    return 0;
  else
    return (Am_Slot_Key)prev_key;
}